

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

string * __thiscall
symbols::BuiltinFunction::toString_abi_cxx11_(string *__return_storage_ptr__,BuiltinFunction *this)

{
  ostream *poVar1;
  ostringstream local_190 [8];
  ostringstream out;
  BuiltinFunction *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"built-in: ");
  poVar1 = std::operator<<(poVar1,(string *)&this->func_name);
  std::operator<<(poVar1,"() function");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string BuiltinFunction::toString() const
{
    std::ostringstream out;
    out << "built-in: " << func_name << "() function";
    return out.str();
}